

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O1

void usage(void)

{
  puts(
      "usage\n    -r remote addr at NetTLP link\n    -l local addr at NetTLP link\n\n    -R remote host addr to get BAR4 start address\n    or\n    -a start addess (HEX)\n    -b bus number, XX:XX\n\n  initialize with packets options\n    -n nuber of packets\n    -s packet size\n\n  testing options\n    -m sleep on mrd (usec)\n\n  output options\n    -H no hexdump\n    -S no stdout"
      );
  return;
}

Assistant:

void usage(void)
{
	printf("usage\n"
	       "    -r remote addr at NetTLP link\n"
	       "    -l local addr at NetTLP link\n"
	       "\n"
	       "    -R remote host addr to get BAR4 start address\n"
	       "    or\n"
	       "    -a start addess (HEX)\n"
	       "    -b bus number, XX:XX\n"
	       "\n"
	       "  initialize with packets options\n"
	       "    -n nuber of packets\n"
	       "    -s packet size\n"
	       "\n"
	       "  testing options\n"
	       "    -m sleep on mrd (usec)\n"
	       "\n"
	       "  output options\n"
	       "    -H no hexdump\n"
	       "    -S no stdout\n"
		);
}